

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalMismatchException::format
          (string *__return_storage_ptr__,ApprovalMismatchException *this,string *received,
          string *approved)

{
  ostream *poVar1;
  stringstream s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = ::std::operator<<(local_190,"Failed Approval: \n");
  poVar1 = ::std::operator<<(poVar1,"Received does not match approved \n");
  poVar1 = ::std::operator<<(poVar1,"Received : \"");
  poVar1 = ::std::operator<<(poVar1,(string *)received);
  poVar1 = ::std::operator<<(poVar1,"\" \n");
  poVar1 = ::std::operator<<(poVar1,"Approved : \"");
  poVar1 = ::std::operator<<(poVar1,(string *)approved);
  ::std::operator<<(poVar1,"\"");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalMismatchException::format(const std::string& received,
                                                  const std::string& approved)
    {
        std::stringstream s;
        s << "Failed Approval: \n"
          << "Received does not match approved \n"
          << "Received : \"" << received << "\" \n"
          << "Approved : \"" << approved << "\"";
        return s.str();
    }